

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O1

void Omega_h::binary::read_array<int>
               (istream *stream,Read<int> *array,bool is_compressed,bool needs_swapping)

{
  Alloc *this;
  uint size_in;
  int iVar1;
  void *pvVar2;
  int *piVar3;
  undefined7 in_register_00000009;
  _Alloc_hider __n;
  undefined8 uVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  char *pcVar5;
  long lVar6;
  LO size;
  I64 compressed_bytes;
  uLong dest_bytes;
  HostWrite<int> uncompressed;
  uint local_8c;
  string local_88;
  long local_68;
  HostWrite<int> local_60;
  Write<int> local_50;
  Read<signed_char> local_40;
  
  __n._M_p = (pointer)CONCAT71(in_register_00000009,needs_swapping);
  std::istream::read((char *)stream,(long)&local_8c);
  if ((int)(Alloc *)CONCAT71(in_register_00000009,needs_swapping) != 0) {
    local_8c = local_8c >> 0x18 | (local_8c & 0xff0000) >> 8 | (local_8c & 0xff00) << 8 |
               local_8c << 0x18;
  }
  size_in = local_8c;
  lVar6 = (long)(int)local_8c;
  if (lVar6 < 0) {
    fail("assertion %s failed at %s +%d\n","size >= 0",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_file.cpp"
         ,0x9b);
  }
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  HostWrite<int>::HostWrite(&local_60,size_in,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  lVar6 = lVar6 * 4;
  if (is_compressed) {
    std::istream::read((char *)stream,(long)&local_88);
    if (needs_swapping) {
      local_88._M_dataplus._M_p =
           (pointer)((ulong)local_88._M_dataplus._M_p >> 0x38 |
                     ((ulong)local_88._M_dataplus._M_p & 0xff000000000000) >> 0x28 |
                     ((ulong)local_88._M_dataplus._M_p & 0xff0000000000) >> 0x18 |
                     ((ulong)local_88._M_dataplus._M_p & 0xff00000000) >> 8 |
                     ((ulong)local_88._M_dataplus._M_p & 0xff000000) << 8 |
                     ((ulong)local_88._M_dataplus._M_p & 0xff0000) << 0x18 |
                     ((ulong)local_88._M_dataplus._M_p & 0xff00) << 0x28 |
                    (long)local_88._M_dataplus._M_p << 0x38);
    }
    if ((long)local_88._M_dataplus._M_p < 0) {
      fail("assertion %s failed at %s +%d\n","compressed_bytes >= 0",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_file.cpp"
           ,0xa3);
    }
    pvVar2 = operator_new__((ulong)local_88._M_dataplus._M_p);
    std::istream::read((char *)stream,(long)pvVar2);
    __n._M_p = local_88._M_dataplus._M_p;
    local_68 = lVar6;
    piVar3 = HostWrite<int>::data(&local_60);
    piVar3 = nonnull<int>(piVar3);
    iVar1 = uncompress(piVar3,&local_68,pvVar2);
    if (iVar1 == 0) {
      if (local_68 == lVar6) {
        operator_delete__(pvVar2);
        pvVar2 = extraout_RDX;
        goto LAB_002bfd9f;
      }
      uVar4 = 0xad;
      pcVar5 = "dest_bytes == static_cast<uLong>(uncompressed_bytes)";
    }
    else {
      uVar4 = 0xac;
      pcVar5 = "ret == Z_OK";
    }
    fail("assertion %s failed at %s +%d\n",pcVar5,
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_file.cpp"
         ,uVar4);
  }
  piVar3 = HostWrite<int>::data(&local_60);
  piVar3 = nonnull<int>(piVar3);
  std::istream::read((char *)stream,(long)piVar3);
  pvVar2 = extraout_RDX_00;
LAB_002bfd9f:
  HostWrite<int>::write((HostWrite<int> *)&local_50,(int)&local_60,pvVar2,(size_t)__n._M_p);
  Read<int>::Read(&local_40,&local_50);
  swap_bytes<int>((binary *)&local_88,(Read<int> *)&local_40,needs_swapping);
  this = (array->write_).shared_alloc_.alloc;
  if (((ulong)this & 7) == 0 && this != (Alloc *)0x0) {
    piVar3 = &this->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(this);
      operator_delete(this,0x48);
    }
  }
  (array->write_).shared_alloc_.alloc = (Alloc *)local_88._M_dataplus._M_p;
  (array->write_).shared_alloc_.direct_ptr = (void *)local_88._M_string_length;
  if ((((ulong)local_88._M_dataplus._M_p & 7) == 0 &&
       (Alloc *)local_88._M_dataplus._M_p != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    *(int *)(local_88._M_dataplus._M_p + 0x30) = *(int *)(local_88._M_dataplus._M_p + 0x30) + -1;
    (array->write_).shared_alloc_.alloc = (Alloc *)(*(size_type *)local_88._M_dataplus._M_p * 8 + 1)
    ;
  }
  local_88._M_dataplus._M_p = (pointer)0x0;
  local_88._M_string_length = 0;
  if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
      local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar3 = &(local_40.write_.shared_alloc_.alloc)->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(local_40.write_.shared_alloc_.alloc);
      operator_delete(local_40.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_50.shared_alloc_.alloc & 7) == 0 && local_50.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar3 = &(local_50.shared_alloc_.alloc)->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(local_50.shared_alloc_.alloc);
      operator_delete(local_50.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar3 = &(local_60.write_.shared_alloc_.alloc)->use_count;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      Alloc::~Alloc(local_60.write_.shared_alloc_.alloc);
      operator_delete(local_60.write_.shared_alloc_.alloc,0x48);
    }
  }
  return;
}

Assistant:

void read_array(std::istream& stream, Read<T>& array, bool is_compressed,
    bool needs_swapping) {
  LO size;
  read_value(stream, size, needs_swapping);
  OMEGA_H_CHECK(size >= 0);
  I64 uncompressed_bytes =
      static_cast<I64>(static_cast<std::size_t>(size) * sizeof(T));
  HostWrite<T> uncompressed(size);
#ifdef OMEGA_H_USE_ZLIB
  if (is_compressed) {
    I64 compressed_bytes;
    read_value(stream, compressed_bytes, needs_swapping);
    OMEGA_H_CHECK(compressed_bytes >= 0);
    auto compressed = new ::Bytef[compressed_bytes];
    stream.read(reinterpret_cast<char*>(compressed), compressed_bytes);
    uLong dest_bytes = static_cast<uLong>(uncompressed_bytes);
    uLong source_bytes = static_cast<uLong>(compressed_bytes);
    ::Bytef* uncompressed_ptr =
        reinterpret_cast< ::Bytef*>(nonnull(uncompressed.data()));
    int ret =
        ::uncompress(uncompressed_ptr, &dest_bytes, compressed, source_bytes);
    OMEGA_H_CHECK(ret == Z_OK);
    OMEGA_H_CHECK(dest_bytes == static_cast<uLong>(uncompressed_bytes));
    delete[] compressed;
  } else
#else
  OMEGA_H_CHECK(is_compressed == false);
#endif
  {
    stream.read(reinterpret_cast<char*>(nonnull(uncompressed.data())),
        uncompressed_bytes);
  }
  array = swap_bytes(Read<T>(uncompressed.write()), needs_swapping);
}